

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_failures.c
# Opt level: O0

void test_write_disk_failures(void)

{
  wchar_t line;
  archive_entry *entry;
  archive *_a;
  void *in_stack_00000010;
  int fd;
  archive *a;
  archive_entry *ae;
  archive_entry *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  wchar_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  wchar_t line_00;
  
  assertion_umask((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                  (wchar_t)in_stack_ffffffffffffffd8);
  assertion_make_dir((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     in_stack_ffffffffffffffe4,(char *)in_stack_ffffffffffffffd8,L'\0');
  line = open("dir/testfile",0x41,0x1ff);
  if (line < L'\0') {
    entry = archive_entry_new();
    assertion_assert(in_stack_fffffffffffffff0,line,in_stack_ffffffffffffffe8,
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (char *)in_stack_ffffffffffffffd8);
    archive_entry_set_mode(entry,0x81ed);
    archive_entry_set_size(entry,8);
    _a = archive_write_disk_new();
    assertion_assert((char *)_a,line,in_stack_ffffffffffffffe8,
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
    archive_write_disk_set_options(_a,L'\x04');
    archive_entry_set_mtime(entry,0x75bcd15,0);
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
    assertion_equal_int((char *)entry,(wchar_t)((ulong)_a >> 0x20),
                        CONCAT44(line,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)_a,(char *)0x1ce08f,in_stack_00000010);
    archive_write_finish_entry((archive *)0x1ce099);
    assertion_equal_int((char *)entry,(wchar_t)((ulong)_a >> 0x20),
                        CONCAT44(line,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)_a,(char *)0x1ce0c8,in_stack_00000010);
    line_00 = (wchar_t)((ulong)_a >> 0x20);
    archive_write_free((archive *)0x1ce0d2);
    assertion_equal_int((char *)entry,line_00,CONCAT44(line,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x1ce100,in_stack_00000010);
    archive_entry_free((archive_entry *)0x1ce10a);
  }
  else {
    close(line);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_failures.c"
                   ,L'0');
    test_skipping("Can\'t test writing to non-writable directory");
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_failures)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("archive_write_disk interface");
#else
	struct archive_entry *ae;
	struct archive *a;
	int fd;

	/* Force the umask to something predictable. */
	assertUmask(022);

	/* A directory that we can't write to. */
	assertMakeDir("dir", 0555);

	/* Can we? */
	fd = open("dir/testfile", O_WRONLY | O_CREAT | O_BINARY, 0777);
	if (fd >= 0) {
	  /* Apparently, we can, so the test below won't work. */
	  close(fd);
	  skipping("Can't test writing to non-writable directory");
	  return;
	}

	/* Try to extract a regular file into the directory above. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir/file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assert((a = archive_write_disk_new()) != NULL);
        archive_write_disk_set_options(a, ARCHIVE_EXTRACT_TIME);
	archive_entry_set_mtime(ae, 123456789, 0);
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	assertEqualIntA(a, 0, archive_write_finish_entry(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	archive_entry_free(ae);
#endif
}